

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_6379f8::HandleImportedRuntimeArtifactsMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _Any_data *p_Var1;
  pointer pcVar2;
  cmInstallCommandArguments *typeArgs;
  cmMakefile *this;
  pointer pbVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  cmArgumentParser<void> *this_00;
  string *psVar9;
  cmGlobalGenerator *pcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  undefined8 uVar11;
  ulong uVar12;
  cmInstallImportedRuntimeArtifactsGenerator *pcVar13;
  pointer name;
  cmInstallImportedRuntimeArtifactsGenerator *pcVar14;
  ulong uVar15;
  cmInstallImportedRuntimeArtifactsGenerator *library;
  cmInstallImportedRuntimeArtifactsGenerator *pcVar16;
  static_string_view name_00;
  static_string_view name_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  string system;
  cmTarget *target;
  Helper helper;
  anon_class_48_1_585e00ec createInstallGenerator;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string runtimeDependencySetArg;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genericArgVector;
  ArgVectors argVectors;
  cmInstallCommandArguments genericArgs;
  cmInstallCommandArguments bundleArgs;
  cmInstallCommandArguments frameworkArgs;
  cmInstallCommandArguments runtimeArgs;
  cmInstallCommandArguments libraryArgs;
  cmInstallRuntimeDependencySet *local_ca8;
  undefined1 local_c98 [16];
  undefined1 local_c88 [48];
  undefined1 local_c58 [16];
  undefined1 local_c48 [32];
  undefined1 local_c28 [32];
  undefined1 local_c08 [16];
  undefined1 local_bf8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_be8;
  _Alloc_hider local_bd8;
  element_type *local_bd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bc8;
  undefined1 local_bb8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ba8;
  _Alloc_hider local_b98;
  element_type *local_b90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b88;
  cmTarget **local_b78;
  undefined8 local_b68;
  cmGeneratorTarget *local_b60;
  undefined1 local_b58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b18;
  cmTarget **local_af8;
  ulong local_af0;
  cmTarget **local_ae8;
  ulong local_ae0;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  undefined1 local_a38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_a00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_9d0;
  ParseResult local_9b8;
  ParseResult local_988;
  ParseResult local_958;
  ParseResult local_928;
  ParseResult local_8f8;
  cmInstallCommandArguments local_8c8;
  cmInstallCommandArguments local_710;
  cmInstallCommandArguments local_558;
  cmInstallCommandArguments local_3a0;
  cmInstallCommandArguments local_1e8;
  
  Helper::Helper((Helper *)&local_be8,status);
  local_b88._M_allocated_capacity = 0;
  local_b88._8_8_ = (cmTarget **)0x0;
  local_b78 = (cmTarget **)0x0;
  if (((anonymous_namespace)::
       HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::argHelper == '\0') &&
     (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::argHelper), iVar8 != 0)) {
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker =
         (_Invoker_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._8_8_ = 0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_manager = (_Manager_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue._M_invoker =
         (_Invoker_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
    _M_functor._M_unused._M_object = (void *)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_functor._8_8_ = 0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_manager = (_Manager_type)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
    super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    name_02.super_string_view._M_str = "LIBRARY";
    name_02.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_02,0);
    name_03.super_string_view._M_str = "RUNTIME";
    name_03.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_03,0x18);
    name_04.super_string_view._M_str = "FRAMEWORK";
    name_04.super_string_view._M_len = 9;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_04,0x30);
    name_05.super_string_view._M_str = "BUNDLE";
    name_05.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&local_8c8,name_05,0x48);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleImportedRuntimeArtifactsMode::argHelper,(ActionMap *)&local_8c8);
    ArgumentParser::Base::~Base((Base *)&local_8c8);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleImportedRuntimeArtifactsMode::argHelper,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleImportedRuntimeArtifactsMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::argHelper);
  }
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a38;
  local_a38._0_8_ = (pointer)0x0;
  local_a38._8_8_ = (pointer)0x0;
  local_a38._16_8_ = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_functor._M_unused._0_8_ = (undefined8)(local_a38 + 0x20);
  vStack_9d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_9d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_9d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_a00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_a00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_a00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&HandleImportedRuntimeArtifactsMode::argHelper;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_functor._8_8_ = 0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue.
  super__Function_base._M_manager = (_Manager_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.KeywordMissingValue._M_invoker =
       (_Invoker_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_functor._M_unused._M_object = (void *)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_functor._8_8_ = 0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.super__Function_base.
  _M_manager = (_Manager_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker =
       (_Invoker_type)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.Positions.
                        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        .
                        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)&local_8c8,args,0);
  if (local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker !=
      (_Invoker_type)0x0) {
    p_Var1 = (_Any_data *)
             ((long)&local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword.
                     super__Function_base + 8);
    (*local_8c8.super_cmArgumentParser<void>.super_Base.Bindings.ParsedKeyword._M_invoker)
              (p_Var1,p_Var1,__destroy_functor);
  }
  local_b18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_b18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  local_b38._M_string_length = 0;
  local_b38.field_2._M_local_buf[0] = '\0';
  local_b58._16_8_ = (pointer)0x0;
  local_b58._0_8_ = (pointer)0x0;
  local_b58._8_8_ = (pointer)0x0;
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a58,local_bd8._M_p,local_bd8._M_p + (long)&local_bd0->Value);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_8c8,&local_a58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  name_00.super_string_view._M_str = "IMPORTED_RUNTIME_ARTIFACTS";
  name_00.super_string_view._M_len = 0x1a;
  this_00 = cmArgumentParser<void>::
            Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&local_8c8.super_cmArgumentParser<void>,name_00,
                       (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_b18);
  name_01.super_string_view._M_str = "RUNTIME_DEPENDENCY_SET";
  name_01.super_string_view._M_len = 0x16;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_01,&local_b38);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_8f8,&local_8c8.super_cmArgumentParser<void>,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a38,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b58,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_8f8);
  bVar5 = cmInstallCommandArguments::Finalize(&local_8c8);
  local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a78,local_bd8._M_p,local_bd8._M_p + (long)&local_bd0->Value);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_1e8,&local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
    operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
  }
  local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a98,local_bd8._M_p,local_bd8._M_p + (long)&local_bd0->Value);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_3a0,&local_a98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
  }
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ab8,local_bd8._M_p,local_bd8._M_p + (long)&local_bd0->Value);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_558,&local_ab8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
  }
  local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ad8,local_bd8._M_p,local_bd8._M_p + (long)&local_bd0->Value);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_710,&local_ad8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
  }
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_928,&local_1e8.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_a38 + 0x20),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b58,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_928);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_958,&local_3a0.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vStack_a00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b58,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_958);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_988,&local_558.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_9e8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b58,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_988);
  cmArgumentParser<void>::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_9b8,&local_710.super_cmArgumentParser<void>,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&vStack_9d0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b58,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_9b8);
  if (local_b58._0_8_ == local_b58._8_8_) {
    local_710.GenericArguments = &local_8c8;
    local_558.GenericArguments = &local_8c8;
    local_3a0.GenericArguments = &local_8c8;
    local_1e8.GenericArguments = &local_8c8;
    if ((((bVar5) && (bVar5 = cmInstallCommandArguments::Finalize(&local_1e8), bVar5)) &&
        (bVar5 = cmInstallCommandArguments::Finalize(&local_3a0), bVar5)) &&
       ((bVar5 = cmInstallCommandArguments::Finalize(&local_558), bVar5 &&
        (bVar5 = cmInstallCommandArguments::Finalize(&local_710), bVar5)))) {
      if (local_b38._M_string_length == 0) {
        local_ca8 = (cmInstallRuntimeDependencySet *)0x0;
      }
      else {
        this = (cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_);
        local_bb8._0_8_ = &local_ba8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_bb8,"CMAKE_HOST_SYSTEM_NAME","");
        psVar9 = cmMakefile::GetSafeDefinition(this,(string *)local_bb8);
        pcVar2 = (psVar9->_M_dataplus)._M_p;
        local_c58._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)local_c48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c58,pcVar2,pcVar2 + psVar9->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_bb8._0_8_ != &local_ba8) {
          operator_delete((void *)local_bb8._0_8_,(ulong)(local_ba8._0_8_ + 1));
        }
        bVar5 = cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies((string *)local_c58)
        ;
        if (bVar5) {
          pcVar10 = cmMakefile::GetGlobalGenerator
                              ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_));
          local_ca8 = cmGlobalGenerator::GetNamedRuntimeDependencySet(pcVar10,&local_b38);
        }
        else {
          local_bb8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4e;
          local_bb8._8_8_ =
               "IMPORTED_RUNTIME_ARTIFACTS RUNTIME_DEPENDENCY_SET is not supported on system \"";
          local_c98._0_8_ = local_c58._8_8_;
          local_c98._8_8_ = local_c58._0_8_;
          local_c88[0x27] = '\"';
          cmStrCat<char>((string *)local_c28,(cmAlphaNum *)local_bb8,(cmAlphaNum *)local_c98,
                         local_c88 + 0x27);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c28._0_8_ !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_c28 + 0x10)) {
            operator_delete((void *)local_c28._0_8_,(ulong)(local_c28._16_8_ + 1));
          }
          local_ca8 = (cmInstallRuntimeDependencySet *)0x0;
        }
        if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c58._0_8_ !=
            (cmInstallImportedRuntimeArtifactsGenerator *)local_c48) {
          operator_delete((void *)local_c58._0_8_,(ulong)(local_c48._0_8_ + 1));
        }
        if (!bVar5) goto LAB_0020837c;
      }
      pbVar3 = local_b18.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      name = local_b18.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if (local_b18.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_b18.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar5 = true;
      }
      else {
        do {
          bVar5 = cmMakefile::IsAlias((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_),name)
          ;
          if (bVar5) {
            local_bb8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x29;
            local_bb8._8_8_ = "IMPORTED_RUNTIME_ARTIFACTS given target \"";
            local_c98._8_8_ = (name->_M_dataplus)._M_p;
            local_c98._0_8_ = name->_M_string_length;
            cmStrCat<char[21]>((string *)local_c58,(cmAlphaNum *)local_bb8,(cmAlphaNum *)local_c98,
                               (char (*) [21])"\" which is an alias.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00208364:
            pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c58._0_8_;
            if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c58._0_8_ !=
                (cmInstallImportedRuntimeArtifactsGenerator *)local_c48) goto LAB_0020788c;
            goto LAB_0020837c;
          }
          local_c28._0_8_ =
               cmMakefile::FindTargetToUse
                         ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_),name,false);
          if (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c28._0_8_ ==
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0) || (bVar5 = cmTarget::IsImported((cmTarget *)local_c28._0_8_), !bVar5)) {
            pcVar10 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_));
            this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)cmGlobalGenerator::FindTarget(pcVar10,name,true);
            if ((this_01 ==
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0) || (bVar5 = cmTarget::IsImported((cmTarget *)this_01), !bVar5))
            goto LAB_00207b1e;
          }
          else {
LAB_00207b1e:
            this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c28._0_8_;
            if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c28._0_8_ ==
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
              local_bb8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x29;
              local_bb8._8_8_ = "IMPORTED_RUNTIME_ARTIFACTS given target \"";
              local_c98._8_8_ = (name->_M_dataplus)._M_p;
              local_c98._0_8_ = name->_M_string_length;
              cmStrCat<char[24]>((string *)local_c58,(cmAlphaNum *)local_bb8,(cmAlphaNum *)local_c98
                                 ,(char (*) [24])"\" which does not exist.");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00208364;
            }
          }
          local_c28._0_8_ = this_01;
          TVar7 = cmTarget::GetType((cmTarget *)local_c28._0_8_);
          if (((TVar7 != EXECUTABLE) &&
              (TVar7 = cmTarget::GetType((cmTarget *)local_c28._0_8_), TVar7 != SHARED_LIBRARY)) &&
             (TVar7 = cmTarget::GetType((cmTarget *)local_c28._0_8_), TVar7 != MODULE_LIBRARY)) {
            local_bb8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x29;
            local_bb8._8_8_ = "IMPORTED_RUNTIME_ARTIFACTS given target \"";
            local_c98._8_8_ = (name->_M_dataplus)._M_p;
            local_c98._0_8_ = name->_M_string_length;
            cmStrCat<char[50]>((string *)local_c58,(cmAlphaNum *)local_bb8,(cmAlphaNum *)local_c98,
                               (char (*) [50])"\" which is not an executable, library, or module.");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00208364;
          }
          if ((cmTarget **)local_b88._8_8_ == local_b78) {
            std::vector<cmTarget*,std::allocator<cmTarget*>>::_M_realloc_insert<cmTarget*const&>
                      ((vector<cmTarget*,std::allocator<cmTarget*>> *)local_b88._M_local_buf,
                       (iterator)local_b88._8_8_,(cmTarget **)local_c28);
          }
          else {
            *(undefined8 *)local_b88._8_8_ = local_c28._0_8_;
            local_b88._8_8_ = local_b88._8_8_ + 8;
          }
          name = name + 1;
        } while (name != pbVar3);
        local_bb8._4_4_ = local_be8._M_allocated_capacity._4_4_;
        local_bb8._0_4_ = local_be8._M_allocated_capacity._0_4_;
        local_bb8._12_4_ = local_be8._12_4_;
        local_bb8._8_4_ = local_be8._8_4_;
        local_ba8._M_allocated_capacity = (size_type)&local_b98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_ba8,local_bd8._M_p,local_bd8._M_p + (long)&local_bd0->Value);
        bVar5 = true;
        local_af8 = (cmTarget **)local_b88._8_8_;
        if (local_b88._M_allocated_capacity != local_b88._8_8_) {
          uVar15 = 0;
          local_b60 = (cmGeneratorTarget *)0x0;
          local_b68 = 0;
          uVar12 = 0;
          uVar11 = local_b88._M_allocated_capacity;
          do {
            typeArgs = *(cmInstallCommandArguments **)uVar11;
            local_af0 = uVar12;
            local_ae8 = (cmTarget **)uVar11;
            local_ae0 = uVar15;
            TVar7 = cmTarget::GetType((cmTarget *)typeArgs);
            if (TVar7 == EXECUTABLE) {
              bVar6 = cmTarget::IsAppBundleOnApple((cmTarget *)typeArgs);
              if (bVar6) {
                psVar9 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_710);
                if (psVar9->_M_string_length == 0) {
                  local_c98._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x5c;
                  local_c98._8_8_ =
                       "IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE DESTINATION for MACOSX_BUNDLE executable target \""
                  ;
                  psVar9 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
                  local_c58._8_8_ = (psVar9->_M_dataplus)._M_p;
                  local_c58._0_8_ = psVar9->_M_string_length;
                  cmStrCat<char[3]>((string *)local_c28,(cmAlphaNum *)local_c98,
                                    (cmAlphaNum *)local_c58,(char (*) [3])0x6aed64);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c28._0_8_ !=
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_c28 + 0x10)) {
                    operator_delete((void *)local_c28._0_8_,(ulong)(local_c28._16_8_ + 1));
                  }
                  bVar5 = false;
                  goto LAB_002085bd;
                }
                cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_710);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_c98,(cmTarget *)local_bb8,typeArgs,
                           (string *)&local_710);
                pcVar13 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c98._0_8_;
                if (local_ca8 == (cmInstallRuntimeDependencySet *)0x0) {
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                }
                else {
                  bVar6 = (anonymous_namespace)::
                          AddBundleExecutable<cmInstallImportedRuntimeArtifactsGenerator*>
                                    ((Helper *)&local_be8,local_ca8,
                                     (cmInstallImportedRuntimeArtifactsGenerator **)local_c98._0_8_)
                  ;
                  if (!bVar6) {
                    if (pcVar13 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
                      (*(code *)((*(cmInstallImportedRuntimeArtifactsGenerator **)pcVar13)->
                                super_cmInstallGenerator).super_cmScriptGenerator.
                                RuntimeConfigVariable._M_dataplus._M_p)();
                    }
                    goto LAB_002085ab;
                  }
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                }
              }
              else {
                (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                          ((string *)local_c98,&local_be8,&local_3a0);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_c58,(cmTarget *)local_bb8,typeArgs,
                           (string *)&local_3a0);
                pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c58._0_8_;
                local_c58._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c98._0_8_ !=
                    (cmInstallImportedRuntimeArtifactsGenerator *)local_c88) {
                  operator_delete((void *)local_c98._0_8_,local_c88._0_8_ + 1);
                }
                if (local_ca8 == (cmInstallRuntimeDependencySet *)0x0) {
LAB_00207f53:
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  goto LAB_00207fe0;
                }
                library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                cmInstallRuntimeDependencySet::AddExecutable(local_ca8,pcVar14);
                pcVar13 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              }
            }
            else if (TVar7 == SHARED_LIBRARY) {
              bVar6 = cmTarget::IsDLLPlatform((cmTarget *)typeArgs);
              if (bVar6) {
                (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                          ((string *)local_c98,&local_be8,&local_3a0);
                HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                          ((anon_class_48_1_585e00ec *)local_c58,(cmTarget *)local_bb8,typeArgs,
                           (string *)&local_3a0);
                pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c58._0_8_;
                local_c58._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c98._0_8_ !=
                    (cmInstallImportedRuntimeArtifactsGenerator *)local_c88) {
                  operator_delete((void *)local_c98._0_8_,local_c88._0_8_ + 1);
                }
                if (local_ca8 == (cmInstallRuntimeDependencySet *)0x0) goto LAB_00207f53;
                library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                cmInstallRuntimeDependencySet::AddLibrary(local_ca8,pcVar14);
                pcVar13 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              }
              else {
                bVar6 = cmTarget::IsFrameworkOnApple((cmTarget *)typeArgs);
                if (bVar6) {
                  psVar9 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_558);
                  if (psVar9->_M_string_length == 0) {
                    local_c98._0_8_ = &DAT_0000005f;
                    local_c98._8_8_ =
                         "IMPORTED_RUNTIME_ARTIFACTS given no FRAMEWORK DESTINATION for shared library FRAMEWORK target \""
                    ;
                    psVar9 = cmTarget::GetName_abi_cxx11_((cmTarget *)typeArgs);
                    local_c58._8_8_ = (psVar9->_M_dataplus)._M_p;
                    local_c58._0_8_ = psVar9->_M_string_length;
                    cmStrCat<char[3]>((string *)local_c28,(cmAlphaNum *)local_c98,
                                      (cmAlphaNum *)local_c58,(char (*) [3])0x6aed64);
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c28._0_8_ !=
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_c28 + 0x10)) {
                      operator_delete((void *)local_c28._0_8_,(ulong)(local_c28._16_8_ + 1));
                    }
LAB_002085ab:
                    bVar5 = false;
                    goto LAB_002085bd;
                  }
                  cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_558);
                  HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                            ((anon_class_48_1_585e00ec *)local_c98,(cmTarget *)local_bb8,typeArgs,
                             (string *)&local_558);
                  pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c98._0_8_;
                  if (local_ca8 == (cmInstallRuntimeDependencySet *)0x0) {
                    library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                    goto LAB_00207fe3;
                  }
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  cmInstallRuntimeDependencySet::AddLibrary
                            (local_ca8,(cmInstallImportedRuntimeArtifactsGenerator *)local_c98._0_8_
                            );
                  pcVar13 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                }
                else {
                  (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                            ((string *)local_c98,&local_be8,&local_1e8);
                  HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                            ((anon_class_48_1_585e00ec *)local_c58,(cmTarget *)local_bb8,typeArgs,
                             (string *)&local_1e8);
                  library = (cmInstallImportedRuntimeArtifactsGenerator *)local_c58._0_8_;
                  local_c58._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c98._0_8_ !=
                      (cmInstallImportedRuntimeArtifactsGenerator *)local_c88) {
                    operator_delete((void *)local_c98._0_8_,local_c88._0_8_ + 1);
                  }
                  if (local_ca8 == (cmInstallRuntimeDependencySet *)0x0) goto LAB_00207fdd;
                  pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                  cmInstallRuntimeDependencySet::AddLibrary(local_ca8,library);
                  pcVar13 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                }
              }
            }
            else {
              if (TVar7 != MODULE_LIBRARY) {
                __assert_fail("false && \"This should never happen\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallCommand.cxx"
                              ,0x5bc,
                              "bool (anonymous namespace)::HandleImportedRuntimeArtifactsMode(const std::vector<std::string> &, cmExecutionStatus &)"
                             );
              }
              (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                        ((string *)local_c98,&local_be8,&local_1e8);
              HandleImportedRuntimeArtifactsMode::anon_class_48_1_585e00ec::operator()
                        ((anon_class_48_1_585e00ec *)local_c58,(cmTarget *)local_bb8,typeArgs,
                         (string *)&local_1e8);
              library = (cmInstallImportedRuntimeArtifactsGenerator *)local_c58._0_8_;
              local_c58._0_8_ = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c98._0_8_ !=
                  (cmInstallImportedRuntimeArtifactsGenerator *)local_c88) {
                operator_delete((void *)local_c98._0_8_,local_c88._0_8_ + 1);
              }
              if (local_ca8 == (cmInstallRuntimeDependencySet *)0x0) {
LAB_00207fdd:
                pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
LAB_00207fe0:
                pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
LAB_00207fe3:
                pcVar13 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              }
              else {
                pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                pcVar16 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
                cmInstallRuntimeDependencySet::AddModule(local_ca8,library);
                pcVar13 = (cmInstallImportedRuntimeArtifactsGenerator *)0x0;
              }
            }
            local_c88._40_8_ = pcVar16;
            local_bf8._8_8_ = library;
            cmMakefile::AddInstallGenerator
                      ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_),
                       (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                       (local_bf8 + 8));
            uVar4 = local_ae0;
            if ((cmInstallImportedRuntimeArtifactsGenerator *)local_bf8._8_8_ !=
                (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
              (**(code **)(*(long *)local_bf8._8_8_ + 8))();
            }
            local_bf8._8_8_ = 0;
            local_bf8._0_8_ = pcVar14;
            cmMakefile::AddInstallGenerator
                      ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_),
                       (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                       local_bf8);
            if ((cmInstallImportedRuntimeArtifactsGenerator *)local_bf8._0_8_ !=
                (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
              (**(code **)(*(long *)local_bf8._0_8_ + 8))();
            }
            local_bf8._0_8_ = (pointer)0x0;
            local_c08._8_8_ = local_c88._40_8_;
            cmMakefile::AddInstallGenerator
                      ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_),
                       (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                       (local_c08 + 8));
            if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c08._8_8_ !=
                (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
              (**(code **)(*(long *)local_c08._8_8_ + 8))();
            }
            local_c08._8_8_ = 0;
            local_c08._0_8_ = pcVar13;
            cmMakefile::AddInstallGenerator
                      ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_),
                       (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                       local_c08);
            if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c08._0_8_ !=
                (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
              (*(code *)((*(cmInstallImportedRuntimeArtifactsGenerator **)local_c08._0_8_)->
                        super_cmInstallGenerator).super_cmScriptGenerator.RuntimeConfigVariable.
                        _M_dataplus._M_p)();
            }
            uVar12 = CONCAT71((int7)(local_af0 >> 8),
                              (byte)local_af0 |
                              library != (cmInstallImportedRuntimeArtifactsGenerator *)0x0);
            local_b68 = CONCAT71((int7)((ulong)local_b68 >> 8),
                                 (byte)local_b68 |
                                 pcVar14 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0);
            local_b60 = (cmGeneratorTarget *)
                        CONCAT71((int7)((ulong)local_b60 >> 8),
                                 (byte)local_b60 |
                                 pcVar16 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0);
            uVar15 = CONCAT71((int7)(uVar4 >> 8),
                              (byte)uVar4 |
                              pcVar13 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0);
            local_c08._0_8_ = 0;
            uVar11 = local_ae8 + 1;
          } while ((cmTarget **)uVar11 != local_af8);
          if ((local_af0 & 1) != 0 || library != (cmInstallImportedRuntimeArtifactsGenerator *)0x0)
          {
            pcVar10 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_));
            psVar9 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_1e8);
            cmGlobalGenerator::AddInstallComponent(pcVar10,psVar9);
          }
          if ((local_b68 & 1) != 0) {
            pcVar10 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_));
            psVar9 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_3a0);
            cmGlobalGenerator::AddInstallComponent(pcVar10,psVar9);
          }
          if (((ulong)local_b60 & 1) != 0) {
            pcVar10 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_));
            psVar9 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_558);
            cmGlobalGenerator::AddInstallComponent(pcVar10,psVar9);
          }
          if ((uVar4 & 1) != 0 || pcVar13 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
            pcVar10 = cmMakefile::GetGlobalGenerator
                                ((cmMakefile *)CONCAT44(local_be8._12_4_,local_be8._8_4_));
            psVar9 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_710);
            cmGlobalGenerator::AddInstallComponent(pcVar10,psVar9);
          }
        }
LAB_002085bd:
        if ((_Alloc_hider *)local_ba8._0_8_ != &local_b98) {
          operator_delete((void *)local_ba8._0_8_,(ulong)(local_b98._M_p + 1));
        }
      }
      goto LAB_0020837e;
    }
  }
  else {
    local_ba8._8_8_ = *(undefined8 *)local_b58._0_8_;
    local_ba8._M_allocated_capacity = *(size_type *)(local_b58._0_8_ + 8);
    local_bb8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x33;
    local_bb8._8_8_ = "IMPORTED_RUNTIME_ARTIFACTS given unknown argument \"";
    local_b98._M_p = (pointer)0x2;
    local_b90 = (element_type *)0x6aed64;
    views._M_len = 3;
    views._M_array = (iterator)local_bb8;
    cmCatViews_abi_cxx11_((string *)local_c98,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_c48._0_8_ = local_c88._0_8_;
    pcVar14 = (cmInstallImportedRuntimeArtifactsGenerator *)local_c98._0_8_;
    if ((cmInstallImportedRuntimeArtifactsGenerator *)local_c98._0_8_ !=
        (cmInstallImportedRuntimeArtifactsGenerator *)local_c88) {
LAB_0020788c:
      operator_delete(pcVar14,(ulong)(local_c48._0_8_ + 1));
    }
  }
LAB_0020837c:
  bVar5 = false;
LAB_0020837e:
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_710);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_558);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_3a0);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_1e8);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_8c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p,
                    CONCAT71(local_b38.field_2._M_allocated_capacity._1_7_,
                             local_b38.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_9d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_a00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a38 + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a38);
  if ((cmTarget **)local_b88._M_allocated_capacity != (cmTarget **)0x0) {
    operator_delete((void *)local_b88._M_allocated_capacity,(long)local_b78 - local_b88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8._M_p != &local_bc8) {
    operator_delete(local_bd8._M_p,(ulong)(local_bc8._M_allocated_capacity + 1));
  }
  return bVar5;
}

Assistant:

bool HandleImportedRuntimeArtifactsMode(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the IMPORTED_RUNTIME_ARTIFACTS mode.
  std::vector<cmTarget*> targets;

  struct ArgVectors
  {
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Library;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Runtime;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Framework;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Bundle;
  };

  static auto const argHelper = cmArgumentParser<ArgVectors>{}
                                  .Bind("LIBRARY"_s, &ArgVectors::Library)
                                  .Bind("RUNTIME"_s, &ArgVectors::Runtime)
                                  .Bind("FRAMEWORK"_s, &ArgVectors::Framework)
                                  .Bind("BUNDLE"_s, &ArgVectors::Bundle);

  std::vector<std::string> genericArgVector;
  ArgVectors const argVectors = argHelper.Parse(args, &genericArgVector);

  // now parse the generic args (i.e. the ones not specialized on LIBRARY,
  // RUNTIME etc. (see above)
  ArgumentParser::MaybeEmpty<std::vector<std::string>> targetList;
  std::string runtimeDependencySetArg;
  std::vector<std::string> unknownArgs;
  cmInstallCommandArguments genericArgs(helper.DefaultComponentName);
  genericArgs.Bind("IMPORTED_RUNTIME_ARTIFACTS"_s, targetList)
    .Bind("RUNTIME_DEPENDENCY_SET"_s, runtimeDependencySetArg);
  genericArgs.Parse(genericArgVector, &unknownArgs);
  bool success = genericArgs.Finalize();

  cmInstallCommandArguments libraryArgs(helper.DefaultComponentName);
  cmInstallCommandArguments runtimeArgs(helper.DefaultComponentName);
  cmInstallCommandArguments frameworkArgs(helper.DefaultComponentName);
  cmInstallCommandArguments bundleArgs(helper.DefaultComponentName);

  // now parse the args for specific parts of the target (e.g. LIBRARY,
  // RUNTIME etc.
  libraryArgs.Parse(argVectors.Library, &unknownArgs);
  runtimeArgs.Parse(argVectors.Runtime, &unknownArgs);
  frameworkArgs.Parse(argVectors.Framework, &unknownArgs);
  bundleArgs.Parse(argVectors.Bundle, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given unknown argument \"",
               unknownArgs[0], "\"."));
    return false;
  }

  // apply generic args
  libraryArgs.SetGenericArguments(&genericArgs);
  runtimeArgs.SetGenericArguments(&genericArgs);
  frameworkArgs.SetGenericArguments(&genericArgs);
  bundleArgs.SetGenericArguments(&genericArgs);

  success = success && libraryArgs.Finalize();
  success = success && runtimeArgs.Finalize();
  success = success && frameworkArgs.Finalize();
  success = success && bundleArgs.Finalize();

  if (!success) {
    return false;
  }

  cmInstallRuntimeDependencySet* runtimeDependencySet = nullptr;
  if (!runtimeDependencySetArg.empty()) {
    auto system = helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
    if (!cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
          system)) {
      status.SetError(
        cmStrCat("IMPORTED_RUNTIME_ARTIFACTS RUNTIME_DEPENDENCY_SET is not "
                 "supported on system \"",
                 system, '"'));
      return false;
    }
    runtimeDependencySet =
      helper.Makefile->GetGlobalGenerator()->GetNamedRuntimeDependencySet(
        runtimeDependencySetArg);
  }

  // Check if there is something to do.
  if (targetList.empty()) {
    return true;
  }

  for (std::string const& tgt : targetList) {
    if (helper.Makefile->IsAlias(tgt)) {
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which is an alias."));
      return false;
    }
    // Lookup this target in the current directory.
    cmTarget* target = helper.Makefile->FindTargetToUse(tgt);
    if (!target || !target->IsImported()) {
      // If no local target has been found, find it in the global scope.
      cmTarget* const global_target =
        helper.Makefile->GetGlobalGenerator()->FindTarget(tgt, true);
      if (global_target && global_target->IsImported()) {
        target = global_target;
      }
    }
    if (target) {
      // Found the target.  Check its type.
      if (target->GetType() != cmStateEnums::EXECUTABLE &&
          target->GetType() != cmStateEnums::SHARED_LIBRARY &&
          target->GetType() != cmStateEnums::MODULE_LIBRARY) {
        status.SetError(
          cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"", tgt,
                   "\" which is not an executable, library, or module."));
        return false;
      }
      // Store the target in the list to be installed.
      targets.push_back(target);
    } else {
      // Did not find the target.
      status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given target \"",
                               tgt, "\" which does not exist."));
      return false;
    }
  }

  // Keep track of whether we will be performing an installation of
  // any files of the given type.
  bool installsLibrary = false;
  bool installsRuntime = false;
  bool installsFramework = false;
  bool installsBundle = false;

  auto const createInstallGenerator =
    [helper](cmTarget& target, const cmInstallCommandArguments& typeArgs,
             const std::string& destination)
    -> std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator> {
    return cm::make_unique<cmInstallImportedRuntimeArtifactsGenerator>(
      target.GetName(), destination, typeArgs.GetPermissions(),
      typeArgs.GetConfigurations(), typeArgs.GetComponent(),
      cmInstallGenerator::SelectMessageLevel(helper.Makefile),
      typeArgs.GetExcludeFromAll(), typeArgs.GetOptional(),
      helper.Makefile->GetBacktrace());
  };

  // Generate install script code to install the given targets.
  for (cmTarget* ti : targets) {
    // Handle each target type.
    cmTarget& target = *ti;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      libraryGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      runtimeGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      frameworkGenerator;
    std::unique_ptr<cmInstallImportedRuntimeArtifactsGenerator>
      bundleGenerator;

    switch (target.GetType()) {
      case cmStateEnums::SHARED_LIBRARY:
        if (target.IsDLLPlatform()) {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(runtimeGenerator.get());
          }
        } else if (target.IsFrameworkOnApple()) {
          if (frameworkArgs.GetDestination().empty()) {
            status.SetError(cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no "
                                     "FRAMEWORK DESTINATION for shared "
                                     "library FRAMEWORK target \"",
                                     target.GetName(), "\"."));
            return false;
          }
          frameworkGenerator = createInstallGenerator(
            target, frameworkArgs, frameworkArgs.GetDestination());
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(frameworkGenerator.get());
          }
        } else {
          libraryGenerator = createInstallGenerator(
            target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddLibrary(libraryGenerator.get());
          }
        }
        break;
      case cmStateEnums::MODULE_LIBRARY:
        libraryGenerator = createInstallGenerator(
          target, libraryArgs, helper.GetLibraryDestination(&libraryArgs));
        if (runtimeDependencySet) {
          runtimeDependencySet->AddModule(libraryGenerator.get());
        }
        break;
      case cmStateEnums::EXECUTABLE:
        if (target.IsAppBundleOnApple()) {
          if (bundleArgs.GetDestination().empty()) {
            status.SetError(
              cmStrCat("IMPORTED_RUNTIME_ARTIFACTS given no BUNDLE "
                       "DESTINATION for MACOSX_BUNDLE executable target \"",
                       target.GetName(), "\"."));
            return false;
          }
          bundleGenerator = createInstallGenerator(
            target, bundleArgs, bundleArgs.GetDestination());
          if (runtimeDependencySet) {
            if (!AddBundleExecutable(helper, runtimeDependencySet,
                                     bundleGenerator.get())) {
              return false;
            }
          }
        } else {
          runtimeGenerator = createInstallGenerator(
            target, runtimeArgs, helper.GetRuntimeDestination(&runtimeArgs));
          if (runtimeDependencySet) {
            runtimeDependencySet->AddExecutable(runtimeGenerator.get());
          }
        }
        break;
      default:
        assert(false && "This should never happen");
        break;
    }

    // Keep track of whether we're installing anything in each category
    installsLibrary = installsLibrary || libraryGenerator;
    installsRuntime = installsRuntime || runtimeGenerator;
    installsFramework = installsFramework || frameworkGenerator;
    installsBundle = installsBundle || bundleGenerator;

    helper.Makefile->AddInstallGenerator(std::move(libraryGenerator));
    helper.Makefile->AddInstallGenerator(std::move(runtimeGenerator));
    helper.Makefile->AddInstallGenerator(std::move(frameworkGenerator));
    helper.Makefile->AddInstallGenerator(std::move(bundleGenerator));
  }

  // Tell the global generator about any installation component names
  // specified
  if (installsLibrary) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      libraryArgs.GetComponent());
  }
  if (installsRuntime) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      runtimeArgs.GetComponent());
  }
  if (installsFramework) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      frameworkArgs.GetComponent());
  }
  if (installsBundle) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      bundleArgs.GetComponent());
  }

  return true;
}